

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileStdio::Open
          (FileStdio *this,string *name,Mode openMode,bool async,bool directio)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  FILE *pFVar4;
  byte in_CL;
  undefined4 in_EDX;
  string *in_RSI;
  long *in_RDI;
  byte in_R8B;
  string *in_stack_00000098;
  FileStdio *in_stack_000000a0;
  type lf_AsyncOpenWrite;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  future<_IO_FILE_*> *in_stack_fffffffffffffed0;
  allocator *paVar5;
  string local_110 [16];
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  type *in_stack_ffffffffffffff30;
  launch in_stack_ffffffffffffff3c;
  undefined1 local_a9 [40];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [50];
  byte local_16;
  byte local_15;
  undefined4 local_14;
  
  local_15 = in_CL & 1;
  local_16 = in_R8B & 1;
  local_14 = in_EDX;
  std::__cxx11::string::operator=((string *)(in_RDI + 9),in_RSI);
  (**(code **)(*in_RDI + 0x98))();
  *(undefined4 *)(in_RDI + 0xd) = local_14;
  iVar1 = (int)in_RDI[0xd];
  if (iVar1 == 1) {
    if ((local_15 & 1) == 0) {
      piVar2 = __errno_location();
      *piVar2 = 0;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pFVar4 = fopen(pcVar3,"wb");
      in_RDI[0x1e] = (long)pFVar4;
    }
    else {
      *(undefined1 *)(in_RDI + 0x1f) = 1;
      std::
      async<adios2::transport::FileStdio::Open(std::__cxx11::string_const&,adios2::Mode,bool,bool)::__0&,std::__cxx11::string_const&>
                (in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::future<_IO_FILE_*>::operator=
                (in_stack_fffffffffffffed0,(future<_IO_FILE_*> *)in_stack_fffffffffffffec8);
      std::future<_IO_FILE_*>::~future((future<_IO_FILE_*> *)0xd5003f);
    }
  }
  else if (iVar1 == 2) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = fopen(pcVar3,"rb");
    in_RDI[0x1e] = (long)pFVar4;
  }
  else if (iVar1 == 3) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = fopen(pcVar3,"rwb");
    in_RDI[0x1e] = (long)pFVar4;
    fseek((FILE *)in_RDI[0x1e],0,2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Toolkit",&local_49);
    paVar5 = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"transport::file::FileStdio",paVar5);
    in_stack_fffffffffffffec8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_a9 + 1),"Open",(allocator *)in_stack_fffffffffffffec8);
    std::operator+((char *)in_stack_ffffffffffffff08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  if ((*(byte *)(in_RDI + 0x1f) & 1) == 0) {
    __rhs = local_110;
    std::operator+((char *)in_stack_ffffffffffffff08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::operator+(in_stack_fffffffffffffec8,(char *)__rhs);
    CheckFile(in_stack_000000a0,in_stack_00000098);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    std::__cxx11::string::~string(local_110);
    *(undefined1 *)((long)in_RDI + 0x6c) = 1;
  }
  return;
}

Assistant:

void FileStdio::Open(const std::string &name, const Mode openMode, const bool async,
                     const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> FILE * {
        errno = 0;
        return std::fopen(name.c_str(), "wb");
    };
    m_Name = name;
    CheckName();
    m_OpenMode = openMode;

    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            errno = 0;
            m_File = std::fopen(name.c_str(), "wb");
        }
        break;
    case Mode::Append:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rwb");
        std::fseek(m_File, 0, SEEK_END);
        break;
    case Mode::Read:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rb");
        break;
    default:
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Open",
                                              "unknown open mode for file " + m_Name);
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to stdio open");
        m_IsOpen = true;
    }
}